

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# const_folding_rules.cpp
# Opt level: O3

Constant *
spvtools::opt::anon_unknown_0::FoldClamp3
          (IRContext *context,Instruction *inst,
          vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>
          *constants)

{
  Constant *pCVar1;
  uint32_t uVar2;
  FeatureManager *pFVar3;
  pointer ppCVar4;
  Constant *pCVar5;
  Constant *pCVar6;
  BinaryScalarFoldingRule local_68;
  vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>
  local_48;
  
  if (inst->opcode_ != OpExtInst) {
    __assert_fail("inst->opcode() == spv::Op::OpExtInst && \"Expecting an extended instruction.\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/const_folding_rules.cpp"
                  ,0x622,
                  "const analysis::Constant *spvtools::opt::(anonymous namespace)::FoldClamp3(IRContext *, Instruction *, const std::vector<const analysis::Constant *> &)"
                 );
  }
  uVar2 = (inst->has_result_id_ & 1) + 1;
  if (inst->has_type_id_ == false) {
    uVar2 = (uint)inst->has_result_id_;
  }
  uVar2 = Instruction::GetSingleWordOperand(inst,uVar2);
  pFVar3 = (context->feature_mgr_)._M_t.
           super___uniq_ptr_impl<spvtools::opt::FeatureManager,_std::default_delete<spvtools::opt::FeatureManager>_>
           ._M_t.
           super__Tuple_impl<0UL,_spvtools::opt::FeatureManager_*,_std::default_delete<spvtools::opt::FeatureManager>_>
           .super__Head_base<0UL,_spvtools::opt::FeatureManager_*,_false>._M_head_impl;
  if (pFVar3 == (FeatureManager *)0x0) {
    IRContext::AnalyzeFeatures(context);
    pFVar3 = (context->feature_mgr_)._M_t.
             super___uniq_ptr_impl<spvtools::opt::FeatureManager,_std::default_delete<spvtools::opt::FeatureManager>_>
             ._M_t.
             super__Tuple_impl<0UL,_spvtools::opt::FeatureManager_*,_std::default_delete<spvtools::opt::FeatureManager>_>
             .super__Head_base<0UL,_spvtools::opt::FeatureManager_*,_false>._M_head_impl;
  }
  if (uVar2 == pFVar3->extinst_importid_GLSLstd450_) {
    ppCVar4 = (constants->
              super__Vector_base<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>
              )._M_impl.super__Vector_impl_data._M_start;
    pCVar5 = ppCVar4[1];
    pCVar1 = ppCVar4[3];
    uVar2 = 0;
    pCVar6 = (Constant *)0x0;
    if (pCVar1 != (Constant *)0x0 && pCVar5 != (Constant *)0x0) {
      local_68.super__Function_base._M_functor._8_8_ = 0;
      local_68.super__Function_base._M_functor._M_unused._M_object = FoldMin;
      local_68._M_invoker =
           std::
           _Function_handler<const_spvtools::opt::analysis::Constant_*(const_spvtools::opt::analysis::Type_*,_const_spvtools::opt::analysis::Constant_*,_const_spvtools::opt::analysis::Constant_*,_spvtools::opt::analysis::ConstantManager_*),_const_spvtools::opt::analysis::Constant_*(*)(const_spvtools::opt::analysis::Type_*,_const_spvtools::opt::analysis::Constant_*,_const_spvtools::opt::analysis::Constant_*,_spvtools::opt::analysis::ConstantManager_*)>
           ::_M_invoke;
      local_68.super__Function_base._M_manager =
           std::
           _Function_handler<const_spvtools::opt::analysis::Constant_*(const_spvtools::opt::analysis::Type_*,_const_spvtools::opt::analysis::Constant_*,_const_spvtools::opt::analysis::Constant_*,_spvtools::opt::analysis::ConstantManager_*),_const_spvtools::opt::analysis::Constant_*(*)(const_spvtools::opt::analysis::Type_*,_const_spvtools::opt::analysis::Constant_*,_const_spvtools::opt::analysis::Constant_*,_spvtools::opt::analysis::ConstantManager_*)>
           ::_M_manager;
      if (inst->has_type_id_ == true) {
        uVar2 = Instruction::GetSingleWordOperand(inst,0);
      }
      ppCVar4 = (pointer)operator_new(0x10);
      local_48.
      super__Vector_base<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>
      ._M_impl.super__Vector_impl_data._M_finish = ppCVar4 + 2;
      *ppCVar4 = pCVar5;
      ppCVar4[1] = pCVar1;
      local_48.
      super__Vector_base<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>
      ._M_impl.super__Vector_impl_data._M_start = ppCVar4;
      local_48.
      super__Vector_base<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage =
           local_48.
           super__Vector_base<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>
           ._M_impl.super__Vector_impl_data._M_finish;
      pCVar5 = FoldFPBinaryOp(&local_68,uVar2,&local_48,context);
      operator_delete(ppCVar4,0x10);
      if (local_68.super__Function_base._M_manager != (_Manager_type)0x0) {
        (*local_68.super__Function_base._M_manager)
                  ((_Any_data *)&local_68,(_Any_data *)&local_68,__destroy_functor);
      }
      pCVar6 = (Constant *)0x0;
      if (pCVar5 == pCVar1) {
        pCVar6 = pCVar1;
      }
    }
    return pCVar6;
  }
  __assert_fail("inst->GetSingleWordInOperand(0) == context->get_feature_mgr()->GetExtInstImportId_GLSLstd450() && \"Expecting a GLSLstd450 extended instruction.\""
                ,
                "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/const_folding_rules.cpp"
                ,0x625,
                "const analysis::Constant *spvtools::opt::(anonymous namespace)::FoldClamp3(IRContext *, Instruction *, const std::vector<const analysis::Constant *> &)"
               );
}

Assistant:

const analysis::Constant* FoldClamp3(
    IRContext* context, Instruction* inst,
    const std::vector<const analysis::Constant*>& constants) {
  assert(inst->opcode() == spv::Op::OpExtInst &&
         "Expecting an extended instruction.");
  assert(inst->GetSingleWordInOperand(0) ==
             context->get_feature_mgr()->GetExtInstImportId_GLSLstd450() &&
         "Expecting a GLSLstd450 extended instruction.");

  const analysis::Constant* x = constants[1];
  const analysis::Constant* max_val = constants[3];

  if (x == nullptr || max_val == nullptr) {
    return nullptr;
  }

  const analysis::Constant* temp =
      FoldFPBinaryOp(FoldMin, inst->type_id(), {x, max_val}, context);
  if (temp == max_val) {
    // We can assume that |min_val| is less than |max_val|.  Therefore, if the
    // result of the max operation is |min_val|, we know the result of the min
    // operation, even if |max_val| is not a constant.
    return max_val;
  }
  return nullptr;
}